

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

void ntru_encode_pubkey(uint16_t *pubkey,uint p,uint q,BinarySink *bs)

{
  uint16_t *rs_in;
  NTRUEncodeSchedule *sched;
  ulong factor1;
  ulong uVar1;
  short sVar2;
  uint uVar3;
  
  factor1 = (ulong)p;
  rs_in = (uint16_t *)safemalloc(factor1,2,0);
  if (p != 0) {
    uVar1 = 0;
    do {
      uVar3 = (uint)pubkey[uVar1] + (q >> 1);
      sVar2 = (short)uVar3 -
              (short)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0
                            ) * (ulong)uVar3 >> 0x30) * (short)q;
      uVar3 = q;
      if ((short)(sVar2 - (short)q) < 0) {
        uVar3 = 0;
      }
      rs_in[uVar1] = sVar2 - (short)uVar3;
      uVar1 = uVar1 + 1;
    } while (factor1 != uVar1);
  }
  sched = ntru_encode_pubkey_schedule(p,q);
  ntru_encode(sched,rs_in,bs);
  safefree(sched->ops);
  safefree(sched);
  smemclr(rs_in,factor1 * 2);
  safefree(rs_in);
  return;
}

Assistant:

void ntru_encode_pubkey(const uint16_t *pubkey, unsigned p, unsigned q,
                        BinarySink *bs)
{
    /* Compute the biased version for encoding */
    uint16_t *biased_pubkey = snewn(p, uint16_t);
    ntru_bias(biased_pubkey, pubkey, q / 2, p, q);

    /* Encode it */
    NTRUEncodeSchedule *sched = ntru_encode_pubkey_schedule(p, q);
    ntru_encode(sched, biased_pubkey, bs);
    ntru_encode_schedule_free(sched);

    ring_free(biased_pubkey, p);
}